

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartApi.cpp
# Opt level: O0

void anon_unknown.dwarf_165396::generateRandomHeaders
               (int partCount,vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *headers,
               vector<(anonymous_namespace)::Task,_std::allocator<(anonymous_namespace)::Task>_>
               *taskList)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  char *pcVar4;
  TileDescription *pTVar5;
  int in_EDI;
  int ty;
  int tx;
  int ly;
  int lx;
  int *numYTiles;
  int *numXTiles;
  int numYLevel;
  int numXLevel;
  int j;
  LevelMode lm;
  int levelMode;
  int tileY;
  int tileX;
  stringstream ss;
  int partType;
  int pixelType;
  Header header;
  int i;
  value_type *in_stack_fffffffffffffca8;
  vector<(anonymous_namespace)::Task,_std::allocator<(anonymous_namespace)::Task>_>
  *in_stack_fffffffffffffcb0;
  value_type *in_stack_fffffffffffffcb8;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *in_stack_fffffffffffffcc0;
  Task local_2c4;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *local_2a0;
  int *local_298;
  int local_290;
  undefined1 local_28c [24];
  int local_274;
  TileDescription local_270;
  LevelMode local_260;
  int local_25c;
  uint local_258;
  uint local_254;
  Channel local_250 [16];
  Channel local_240 [16];
  Channel local_230 [16];
  string local_220 [32];
  stringstream local_200 [16];
  undefined1 local_1f0 [376];
  int local_78;
  int local_64;
  Vec2<float> local_60;
  TileDescription local_58 [3];
  int local_1c;
  int local_4;
  
  local_4 = in_EDI;
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::clear
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)0x1b7bbb);
  for (local_1c = 0; local_1c < local_4; local_1c = local_1c + 1) {
    Imath_3_2::Vec2<float>::Vec2(&local_60,0.0,0.0);
    Imf_3_4::Header::Header
              ((Header *)local_58,0xc5,0x107,1.0,(Vec2 *)&local_60,1.0,INCREASING_Y,ZIP_COMPRESSION)
    ;
    local_64 = random_int((int)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
    local_78 = random_int((int)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
    iVar1 = local_64;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                        (long)local_1c);
    iVar2 = local_78;
    *pvVar3 = iVar1;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::partTypes,
                        (long)local_1c);
    *pvVar3 = iVar2;
    std::__cxx11::stringstream::stringstream(local_200);
    std::ostream::operator<<(local_1f0,local_1c);
    std::__cxx11::stringstream::str();
    Imf_3_4::Header::setName((string *)local_58);
    std::__cxx11::string::~string(local_220);
    if (local_64 == 0) {
      pcVar4 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel(local_230,UINT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar4,(Channel *)"UINT");
    }
    else if (local_64 == 1) {
      pcVar4 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel(local_240,FLOAT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar4,(Channel *)"FLOAT");
    }
    else if (local_64 == 2) {
      pcVar4 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel(local_250,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar4,(Channel *)"HALF");
    }
    if (local_78 == 0) {
      Imf_3_4::Header::setType((string *)local_58);
    }
    else if (local_78 == 1) {
      Imf_3_4::Header::setType((string *)local_58);
    }
    local_25c = 0;
    if (local_78 == 1) {
      iVar2 = random_int((int)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
      local_254 = iVar2 + 1;
      iVar2 = random_int((int)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
      local_258 = iVar2 + 1;
      iVar2 = random_int((int)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
      local_25c = iVar2;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::levelModes,
                          (long)local_1c);
      *pvVar3 = iVar2;
      local_260 = NUM_LEVELMODES;
      if (local_25c == 0) {
        local_260 = ONE_LEVEL;
      }
      else if (local_25c == 1) {
        local_260 = MIPMAP_LEVELS;
      }
      else if (local_25c == 2) {
        local_260 = RIPMAP_LEVELS;
      }
      Imf_3_4::TileDescription::TileDescription(&local_270,local_254,local_258,local_260,ROUND_DOWN)
      ;
      Imf_3_4::Header::setTileDescription(local_58);
    }
    if (local_78 == 0) {
      for (local_274 = 0; local_274 < 0x107; local_274 = local_274 + 1) {
        Task::Task((Task *)(local_28c + 4),local_1c);
        std::vector<(anonymous_namespace)::Task,_std::allocator<(anonymous_namespace)::Task>_>::
        push_back(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      }
    }
    else {
      pTVar5 = (TileDescription *)Imf_3_4::Header::tileDescription();
      in_stack_fffffffffffffcb8 = (value_type *)&local_290;
      in_stack_fffffffffffffcb0 =
           (vector<(anonymous_namespace)::Task,_std::allocator<(anonymous_namespace)::Task>_> *)
           local_28c;
      in_stack_fffffffffffffca8 = (value_type *)&local_2a0;
      Imf_3_4::precalculateTileInfo
                (pTVar5,0,0xc4,0,0x106,&local_298,(int **)in_stack_fffffffffffffca8,
                 (int *)in_stack_fffffffffffffcb0,(int *)in_stack_fffffffffffffcb8);
      for (local_2a4 = 0; local_2a4 < (int)local_28c._0_4_; local_2a4 = local_2a4 + 1) {
        for (local_2a8 = 0; local_2a8 < local_290; local_2a8 = local_2a8 + 1) {
          if ((local_25c != 1) || (local_2a4 == local_2a8)) {
            for (local_2ac = 0; local_2ac < local_298[local_2a4]; local_2ac = local_2ac + 1) {
              for (local_2b0 = 0;
                  local_2b0 <
                  *(int *)((long)&(local_2a0->
                                  super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>
                                  )._M_impl.super__Vector_impl_data._M_start + (long)local_2a8 * 4);
                  local_2b0 = local_2b0 + 1) {
                Task::Task(&local_2c4,local_1c,local_2ac,local_2b0,local_2a4,local_2a8);
                std::
                vector<(anonymous_namespace)::Task,_std::allocator<(anonymous_namespace)::Task>_>::
                push_back(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
              }
            }
          }
        }
      }
      if (local_298 != (int *)0x0) {
        operator_delete__(local_298);
      }
      in_stack_fffffffffffffcc0 = local_2a0;
      if (local_2a0 != (vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)0x0) {
        operator_delete__(local_2a0);
      }
    }
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    std::__cxx11::stringstream::~stringstream(local_200);
    Imf_3_4::Header::~Header((Header *)local_58);
  }
  return;
}

Assistant:

void
generateRandomHeaders (
    int partCount, vector<Header>& headers, vector<Task>& taskList)
{
    headers.clear ();
    for (int i = 0; i < partCount; i++)
    {
        Header header (width, height);
        int    pixelType = random_int (3);
        int    partType  = random_int (2);
        pixelTypes[i]    = pixelType;
        partTypes[i]     = partType;

        stringstream ss;
        ss << i;
        header.setName (ss.str ());

        switch (pixelType)
        {
            case 0:
                header.channels ().insert ("UINT", Channel (IMF::UINT));
                break;
            case 1:
                header.channels ().insert ("FLOAT", Channel (IMF::FLOAT));
                break;
            case 2:
                header.channels ().insert ("HALF", Channel (IMF::HALF));
                break;
        }

        switch (partType)
        {
            case 0: header.setType (SCANLINEIMAGE); break;
            case 1: header.setType (TILEDIMAGE); break;
        }

        int tileX;
        int tileY;
        int levelMode = 0;
        if (partType == 1)
        {
            tileX         = random_int (width) + 1;
            tileY         = random_int (height) + 1;
            levelMode     = random_int (3);
            levelModes[i] = levelMode;
            LevelMode lm  = NUM_LEVELMODES;
            switch (levelMode)
            {
                case 0: lm = ONE_LEVEL; break;
                case 1: lm = MIPMAP_LEVELS; break;
                case 2: lm = RIPMAP_LEVELS; break;
            }
            header.setTileDescription (TileDescription (tileX, tileY, lm));
        }

        //
        // Add lines or tiles to task list.
        //
        if (partType == 0)
        {
            for (int j = 0; j < height; j++)
                taskList.push_back (Task (i));
        }
        else
        {
            int  numXLevel;
            int  numYLevel;
            int* numXTiles;
            int* numYTiles;
            precalculateTileInfo (
                header.tileDescription (),
                0,
                width - 1,
                0,
                height - 1,
                numXTiles,
                numYTiles,
                numXLevel,
                numYLevel);

            for (int lx = 0; lx < numXLevel; lx++)
                for (int ly = 0; ly < numYLevel; ly++)
                {
                    if (levelMode == 1)
                        if (lx != ly) continue;

                    // Get all tasks for this level.
                    for (int tx = 0; tx < numXTiles[lx]; tx++)
                        for (int ty = 0; ty < numYTiles[ly]; ty++)
                            taskList.push_back (Task (i, tx, ty, lx, ly));
                }

            delete[] numXTiles;
            delete[] numYTiles;
        }

        //        if (partType == 0)
        //        {
        //            cout << "pixelType = " << pixelType << " partType = " << partType
        //                 << endl << flush;
        //        }
        //        else
        //        {
        //            cout << "pixelType = " << pixelType << " partType = " << partType
        //                 << " levelMode = " << levelModes[i] << endl << flush;
        //        }

        headers.push_back (header);
    }
}